

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::test_long_double_as_real(void)

{
  char *pcVar1;
  longdouble in_ST3;
  longdouble in_ST6;
  undefined1 local_188 [16];
  undefined1 local_178 [32];
  double local_158;
  type_conflict9 local_150;
  float local_144;
  type_conflict8 local_140 [2];
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined8 local_108;
  type_conflict9 local_100;
  undefined4 local_f4;
  type_conflict8 local_f0 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  longdouble local_b8;
  undefined1 local_a8 [32];
  double local_88;
  type_conflict9 local_80 [2];
  undefined8 local_70;
  type_conflict9 local_68;
  float local_5c;
  type_conflict8 local_58 [2];
  undefined4 local_50 [4];
  type_conflict8 local_40 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_38,(longdouble)0);
  local_40[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","0.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16f8,"void value_suite::test_long_double_as_real()",local_40,local_50);
  local_58[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_5c = trial::dynamic::basic_variable::operator_cast_to_float((basic_variable *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","float(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16f9,"void value_suite::test_long_double_as_real()",local_58,&local_5c);
  local_68 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16fa,"void value_suite::test_long_double_as_real()",&local_68,&local_70);
  local_80[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_88 = trial::dynamic::basic_variable::operator_cast_to_double((basic_variable *)local_38);
  pcVar1 = "double(data)";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","double(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16fb,"void value_suite::test_long_double_as_real()",local_80,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_b8 = (longdouble)0;
  pcVar1 = "0.0L";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","0.0L",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16fc,"void value_suite::test_long_double_as_real()",local_a8,&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  trial::dynamic::basic_variable::operator_cast_to_long_double
            ((longdouble *)local_38,(basic_variable *)pcVar1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","(long double)(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16fd,"void value_suite::test_long_double_as_real()",local_d8,local_e8);
  std::numeric_limits<long_double>::min();
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_38,in_ST3);
  local_f0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_f4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","0.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1700,"void value_suite::test_long_double_as_real()",local_f0,&local_f4);
  local_100 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_38);
  local_108 = 0;
  pcVar1 = "0.0";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1701,"void value_suite::test_long_double_as_real()",&local_100,&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  std::numeric_limits<long_double>::min();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","std::numeric_limits<long double>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1702,"void value_suite::test_long_double_as_real()",local_128,local_138);
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_38,in_ST6);
  local_140[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_144 = std::numeric_limits<float>::infinity();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","std::numeric_limits<float>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1705,"void value_suite::test_long_double_as_real()",local_140,&local_144);
  local_150 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_38);
  local_158 = std::numeric_limits<double>::infinity();
  pcVar1 = "std::numeric_limits<double>::infinity()";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","std::numeric_limits<double>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1706,"void value_suite::test_long_double_as_real()",&local_150,&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  std::numeric_limits<long_double>::max();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","std::numeric_limits<long double>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1707,"void value_suite::test_long_double_as_real()",local_178,local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_long_double_as_real()
{
    variable data(0.0L);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 0.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), float(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 0.0);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), double(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), 0.0L);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), (long double)(data));

    data = std::numeric_limits<long double>::min();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 0.0f); // Underflow
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 0.0); // Underflow
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<long double>::min());

    data = std::numeric_limits<long double>::max();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), std::numeric_limits<float>::infinity()); // Overflow
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), std::numeric_limits<double>::infinity()); // Overflow
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<long double>::max());
}